

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::AddGlobalTarget_Test
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  char *__s;
  undefined8 __s_00;
  bool bVar1;
  int iVar2;
  pointer pcVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string *__x;
  allocator<char> local_281;
  value_type local_280;
  allocator<char> local_259;
  value_type local_258;
  allocator<char> local_231;
  value_type local_230;
  reference local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_1e8;
  undefined1 local_1c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  value_type local_1a8;
  undefined1 local_188 [8];
  cmCustomCommandLine singleLine;
  GlobalTargetInfo gti;
  char *cmakeCfgIntDir;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  const_iterator local_78;
  char **target;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_char_*> *__range1;
  allocator<char> local_41;
  string local_40;
  reference local_20;
  value_type *mf;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  *targets_local;
  cmGlobalGenerator *this_local;
  
  mf = (value_type *)targets;
  targets_local =
       (vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
        *)this;
  local_20 = std::
             vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
             ::operator[](&this->Makefiles,0);
  pcVar3 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->(local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_TESTING_ENABLED",&local_41);
  bVar1 = cmMakefile::IsOn(pcVar3,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __begin1 = (const_iterator)&AddGlobalTarget_Test::reservedTargets;
    __end1 = std::initializer_list<const_char_*>::begin(&AddGlobalTarget_Test::reservedTargets);
    target = std::initializer_list<const_char_*>::end(&AddGlobalTarget_Test::reservedTargets);
    for (; __end1 != target; __end1 = __end1 + 1) {
      local_78 = __end1;
      __s = *__end1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,__s,&local_99);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"when CTest testing is enabled",
                 (allocator<char> *)((long)&cmakeCfgIntDir + 7));
      bVar1 = CheckCMP0037(this,&local_98,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&cmakeCfgIntDir + 7));
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return;
      }
    }
    gti._152_4_ = (*this->_vptr_cmGlobalGenerator[0x15])();
    gti._156_4_ = extraout_var;
    GlobalTargetInfo::GlobalTargetInfo
              ((GlobalTargetInfo *)
               &singleLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar2 = (*this->_vptr_cmGlobalGenerator[0x1e])();
    std::__cxx11::string::operator=
              ((string *)
               &singleLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (char *)CONCAT44(extraout_var_00,iVar2));
    std::__cxx11::string::operator=
              ((string *)(gti.Name.field_2._M_local_buf + 8),"Running tests...");
    gti.WorkingDir.field_2._M_local_buf[8] = '\x01';
    cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)local_188);
    __x = cmSystemTools::GetCTestCommand_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_188,__x);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"--force-new-ctest-process",
               (allocator<char> *)
               ((long)&args.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_188,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&args.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1c8);
    pcVar3 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->(local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"CMAKE_CTEST_ARGUMENTS",(allocator<char> *)((long)&__range2 + 7)
              );
    bVar1 = cmMakefile::GetDefExpandList
                      (pcVar3,&local_1e8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1c8,false);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    if (bVar1) {
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1c8);
      arg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1c8);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&arg), bVar1) {
        local_210 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_188,local_210);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
    }
    bVar1 = cmNonempty((char *)gti._152_8_);
    if ((bVar1) && (*(char *)gti._152_8_ != '.')) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"-C",&local_231);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_188,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::allocator<char>::~allocator(&local_231);
      __s_00 = gti._152_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_258,(char *)__s_00,&local_259);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_188,&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator(&local_259);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"$(ARGS)",&local_281);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_188,&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      std::allocator<char>::~allocator(&local_281);
    }
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
               ((long)&gti.Message.field_2 + 8),(value_type *)local_188);
    std::
    vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
    ::push_back((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                 *)mf,(value_type *)
                      &singleLine.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1c8);
    cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)local_188);
    GlobalTargetInfo::~GlobalTargetInfo
              ((GlobalTargetInfo *)
               &singleLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_Test(
  std::vector<GlobalTargetInfo>& targets)
{
  auto& mf = this->Makefiles[0];
  if (!mf->IsOn("CMAKE_TESTING_ENABLED")) {
    return;
  }

  static const auto reservedTargets = { "test", "RUN_TESTS" };
  for (auto const& target : reservedTargets) {
    if (!this->CheckCMP0037(target, "when CTest testing is enabled")) {
      return;
    }
  }

  const char* cmakeCfgIntDir = this->GetCMakeCFGIntDir();
  GlobalTargetInfo gti;
  gti.Name = this->GetTestTargetName();
  gti.Message = "Running tests...";
  gti.UsesTerminal = true;
  cmCustomCommandLine singleLine;
  singleLine.push_back(cmSystemTools::GetCTestCommand());
  singleLine.push_back("--force-new-ctest-process");
  std::vector<std::string> args;
  if (mf->GetDefExpandList("CMAKE_CTEST_ARGUMENTS", args)) {
    for (auto const& arg : args) {
      singleLine.push_back(arg);
    }
  }
  if (cmNonempty(cmakeCfgIntDir) && cmakeCfgIntDir[0] != '.') {
    singleLine.push_back("-C");
    singleLine.push_back(cmakeCfgIntDir);
  } else // TODO: This is a hack. Should be something to do with the
         // generator
  {
    singleLine.push_back("$(ARGS)");
  }
  gti.CommandLines.push_back(std::move(singleLine));
  targets.push_back(std::move(gti));
}